

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

void __thiscall CFG::~CFG(CFG *this)

{
  pointer pcVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  
  this->_vptr_CFG = (_func_int **)&PTR__CFG_001179d8;
  if (this->m_entryNode != (CfgNode *)0x0) {
    (*this->m_entryNode->_vptr_CfgNode[1])();
  }
  if (this->m_exitNode != (CfgNode *)0x0) {
    (*this->m_exitNode->_vptr_CfgNode[1])();
  }
  if (this->m_haltNode != (CfgNode *)0x0) {
    (*this->m_haltNode->_vptr_CfgNode[1])();
  }
  for (p_Var2 = (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var2[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CfgNode_*>,_std::_Select1st<std::pair<const_unsigned_long,_CfgNode_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
  ::~_Rb_tree(&(this->m_nodesMap)._M_t);
  pcVar1 = (this->m_functionName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->m_functionName).field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

CFG::~CFG() {
	delete m_entryNode;

	if (m_exitNode)
		delete m_exitNode;

	if (m_haltNode)
		delete m_haltNode;

	for (std::map<Addr, CfgNode*>::iterator it = m_nodesMap.begin(),
			ed = m_nodesMap.end(); it != ed; it++) {
		delete it->second;
	}
}